

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264e_slice.c
# Opt level: O2

RK_S32 h264e_slice_write(H264eSlice *slice,void *p,RK_U32 size)

{
  int iVar1;
  RK_U8 *tmp;
  int iVar2;
  char *__s;
  long lVar3;
  MppWriteCtx stream;
  char log [256];
  
  mpp_writer_init(&stream,p,size);
  h264e_slice_write_header(slice,&stream);
  if (((byte)h264e_debug & 0x40) != 0) {
    builtin_strncpy(log,"sw stream: ",0xc);
    iVar2 = 0xb;
    lVar3 = 0;
    while( true ) {
      __s = log + iVar2;
      if (lVar3 == 0x10) break;
      iVar1 = sprintf(__s,"%02x ",(ulong)*(byte *)((long)p + lVar3));
      iVar2 = iVar2 + iVar1;
      lVar3 = lVar3 + 1;
    }
    __s[0] = '\n';
    __s[1] = '\0';
    if (((byte)h264e_debug & 0x40) != 0) {
      _mpp_log_l(4,"h264e_slice",log,"h264e_slice_write");
    }
  }
  return stream.buffered_bits + stream.byte_cnt * 8;
}

Assistant:

RK_S32 h264e_slice_write(H264eSlice *slice, void *p, RK_U32 size)
{
    MppWriteCtx stream;
    MppWriteCtx *s = &stream;
    RK_S32 bitCnt = 0;

    mpp_writer_init(s, p, size);

    h264e_slice_write_header(slice, s);

    bitCnt = s->buffered_bits + s->byte_cnt * 8;

    // update on cabac mode
    if (slice->entropy_coding_mode)
        bitCnt = s->buffered_bits + s->byte_cnt * 8;

    if (h264e_debug & H264E_DBG_SLICE) {
        RK_S32 i;
        RK_U8 *tmp = p;
        RK_S32 pos = 0;
        char log[256];

        pos = sprintf(log + pos, "sw stream: ");
        for (i = 0; i < 16; i ++) {
            pos += sprintf(log + pos, "%02x ", tmp[i]);
        }
        pos += sprintf(log + pos, "\n");
        h264e_dbg_slice(log);
    }

    return bitCnt;
}